

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpNegA(word *b,word *a,ec_o *ec)

{
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffffd8;
  word *mod;
  
  mod = *(word **)(in_RDX[3] + 0x30);
  wwCopy(in_RDI,in_RSI,*(size_t *)(in_RDX[3] + 0x30));
  zzNegMod(in_RSI,in_RDX,mod,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ecpNegA(word b[], const word a[], const ec_o* ec)
{
	const size_t n = ec->f->n;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// (xb, yb) <- (xa, -ya)
	qrCopy(ecX(b), ecX(a), ec->f);
	zmNeg(ecY(b, n), ecY(a, n), ec->f);
}